

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1bbabd::BIP324Test::TestBIP324PacketVector
          (BIP324Test *this,uint32_t in_idx,string *in_priv_ours_hex,string *in_ellswift_ours_hex,
          string *in_ellswift_theirs_hex,bool in_initiating,string *in_contents_hex,
          uint32_t in_multiply,string *in_aad_hex,bool in_ignore,string *mid_send_garbage_hex,
          string *mid_recv_garbage_hex,string *out_session_id_hex,string *out_ciphertext_hex,
          string *out_ciphertext_endswith_hex)

{
  long lVar1;
  Span<const_std::byte> ellswift;
  Span<const_std::byte> ellswift_00;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  pbegin;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  string_view hex_str_03;
  string_view hex_str_04;
  string_view hex_str_05;
  string_view hex_str_06;
  string_view hex_str_07;
  string_view hex_str_08;
  Span<const_std::byte> aad;
  Span<const_std::byte> aad_00;
  Span<const_std::byte> input_01;
  Span<const_std::byte> input_02;
  Span<std::byte> contents_00;
  Span<std::byte> contents_01;
  Span<const_std::byte> aad_01;
  Span<const_std::byte> aad_02;
  Span<const_std::byte> contents_02;
  Span<const_std::byte> contents_03;
  Span<std::byte> output;
  Span<std::byte> output_00;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  lazy_ostream *plVar8;
  reference pvVar9;
  size_type sVar10;
  value_type vVar11;
  long in_FS_OFFSET;
  BIP324Cipher *in_stack_ffffffffffffe958;
  BIP324Cipher *this_00;
  BIP324Cipher *in_stack_ffffffffffffe960;
  BIP324Cipher *pv_;
  BIP324Cipher *in_stack_ffffffffffffe968;
  undefined7 in_stack_ffffffffffffe970;
  undefined1 in_stack_ffffffffffffe977;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe978;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffe980;
  undefined7 in_stack_ffffffffffffe988;
  undefined1 in_stack_ffffffffffffe98f;
  lazy_ostream *in_stack_ffffffffffffe990;
  undefined7 in_stack_ffffffffffffe998;
  undefined1 in_stack_ffffffffffffe99f;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffe9a0;
  undefined7 in_stack_ffffffffffffe9a8;
  undefined1 in_stack_ffffffffffffe9af;
  lazy_ostream *in_stack_ffffffffffffe9b0;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
  in_stack_ffffffffffffe9b8;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
  in_stack_ffffffffffffe9c0;
  const_iterator in_stack_ffffffffffffe9c8;
  undefined8 in_stack_ffffffffffffe9d0;
  undefined7 in_stack_ffffffffffffe9d8;
  undefined1 in_stack_ffffffffffffe9df;
  uint32_t in_stack_ffffffffffffe9f8;
  uint32_t uVar12;
  undefined4 in_stack_ffffffffffffea04;
  undefined7 in_stack_ffffffffffffea10;
  undefined7 in_stack_ffffffffffffea30;
  undefined8 in_stack_ffffffffffffea38;
  RandomMixin<FastRandomContext> *pRVar13;
  undefined7 in_stack_ffffffffffffea40;
  undefined1 in_stack_ffffffffffffea47;
  undefined8 in_stack_ffffffffffffea48;
  undefined7 in_stack_ffffffffffffea50;
  undefined1 in_stack_ffffffffffffea57;
  undefined8 in_stack_ffffffffffffea70;
  undefined6 in_stack_ffffffffffffea78;
  undefined1 in_stack_ffffffffffffea7e;
  undefined1 in_stack_ffffffffffffea7f;
  EllSwiftPubKey *in_stack_ffffffffffffea80;
  undefined7 in_stack_ffffffffffffea88;
  undefined1 in_stack_ffffffffffffea8f;
  bool dec_ok;
  uint32_t dec_len;
  uint use_idx;
  uint32_t i_2;
  uint32_t dec_idx;
  uint error;
  uint32_t i_1;
  uint32_t i;
  bool in_ignore_local;
  bool in_initiating_local;
  string *in_ellswift_theirs_hex_local;
  string *in_ellswift_ours_hex_local;
  string *in_priv_ours_hex_local;
  uint32_t in_idx_local;
  BIP324Test *this_local;
  const_string local_1240 [2];
  lazy_ostream local_1220 [2];
  assertion_result local_1200 [2];
  const_string local_11c8 [2];
  lazy_ostream local_11a8 [2];
  assertion_result local_1188 [2];
  const_string local_1150 [2];
  lazy_ostream local_1130 [2];
  assertion_result local_1110 [2];
  BIP324Cipher *local_10d8;
  BIP324Cipher *local_10d0;
  Span<std::byte> local_10a8;
  bool dec_ignore;
  vector<std::byte,_std::allocator<std::byte>_> decrypted;
  vector<std::byte,_std::allocator<std::byte>_> dec_aad;
  vector<std::byte,_std::allocator<std::byte>_> to_decrypt;
  BIP324Cipher *local_1020;
  BIP324Cipher *local_1018;
  bool dec_ignore_1;
  const_string local_f98 [2];
  lazy_ostream local_f78 [2];
  Span<const_std::byte> local_f58;
  assertion_result local_f48 [2];
  const_string local_f10 [2];
  lazy_ostream local_ef0 [2];
  Span<const_std::byte> local_ed0;
  assertion_result local_ec0 [2];
  const_string local_e88 [2];
  lazy_ostream local_e68 [2];
  Span<const_std::byte> local_e48;
  assertion_result local_e38 [2];
  const_string local_e00 [2];
  lazy_ostream local_de0 [2];
  assertion_result local_dc0 [2];
  const_string local_d88 [2];
  lazy_ostream local_d68 [2];
  assertion_result local_d48 [2];
  const_string local_d10 [2];
  lazy_ostream local_cf0 [2];
  assertion_result local_cd0 [2];
  const_string local_c98 [2];
  lazy_ostream local_c78 [3];
  Span<std::byte> local_c48;
  assertion_result local_c38 [2];
  const_string local_c00 [2];
  lazy_ostream local_be0 [2];
  assertion_result local_bc0 [2];
  const_string local_b88 [2];
  lazy_ostream local_b68 [2];
  assertion_result local_b48 [2];
  BIP324Cipher *local_b10;
  BIP324Cipher *pBStack_b08;
  vector<std::byte,_std::allocator<std::byte>_> ciphertext;
  vector<std::byte,_std::allocator<std::byte>_> contents;
  BIP324Cipher *local_a98;
  BIP324Cipher *local_a90;
  vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  dummies;
  const_string local_a48 [2];
  lazy_ostream local_a28 [2];
  Span<const_std::byte> local_a08;
  assertion_result local_9f8 [2];
  const_string local_9c0 [2];
  lazy_ostream local_9a0 [2];
  Span<const_std::byte> local_980;
  assertion_result local_970 [2];
  const_string local_938 [2];
  lazy_ostream local_918 [2];
  Span<const_std::byte> local_8f8;
  assertion_result local_8e8 [2];
  const_string local_8b0 [2];
  lazy_ostream local_890 [2];
  assertion_result local_870 [2];
  const_string local_838 [2];
  lazy_ostream local_818 [2];
  assertion_result local_7f8 [2];
  const_string local_7c0 [2];
  lazy_ostream local_7a0 [2];
  assertion_result local_780 [3];
  CKey key;
  vector<std::byte,_std::allocator<std::byte>_> out_ciphertext_endswith;
  vector<std::byte,_std::allocator<std::byte>_> out_ciphertext;
  vector<std::byte,_std::allocator<std::byte>_> out_session_id;
  vector<std::byte,_std::allocator<std::byte>_> mid_recv_garbage;
  vector<std::byte,_std::allocator<std::byte>_> mid_send_garbage;
  vector<std::byte,_std::allocator<std::byte>_> in_aad;
  vector<std::byte,_std::allocator<std::byte>_> in_contents;
  vector<std::byte,_std::allocator<std::byte>_> in_ellswift_theirs;
  vector<std::byte,_std::allocator<std::byte>_> in_ellswift_ours;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_priv_ours;
  BIP324Cipher dec_cipher;
  BIP324Cipher cipher;
  EllSwiftPubKey ellswift_theirs;
  EllSwiftPubKey ellswift_ours;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<unsigned_char>(hex_str);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_00._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_00._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_00);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_01._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_01._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_01);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_02._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_02._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_02);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_03._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_03._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_03);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_04._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_04._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_04);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_05._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_05._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_05);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_06._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_06._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_06);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_07._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_07._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_07);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe978);
  hex_str_08._M_str = (char *)in_stack_ffffffffffffe9c8._M_current;
  hex_str_08._M_len = (size_t)in_stack_ffffffffffffe9c0._M_current;
  ParseHex<std::byte>(hex_str_08);
  CKey::CKey((CKey *)in_stack_ffffffffffffe958);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe960);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe960);
  pbegin._M_current._7_1_ = in_stack_ffffffffffffe98f;
  pbegin._M_current._0_7_ = in_stack_ffffffffffffe988;
  CKey::
  Set<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((CKey *)in_stack_ffffffffffffe978,pbegin,in_stack_ffffffffffffe980,
             (bool)in_stack_ffffffffffffe977);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffe968,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960,
             in_stack_ffffffffffffe958);
  ellswift.m_size._0_7_ = in_stack_ffffffffffffe988;
  ellswift.m_data = in_stack_ffffffffffffe980._M_current;
  ellswift.m_size._7_1_ = in_stack_ffffffffffffe98f;
  EllSwiftPubKey::EllSwiftPubKey((EllSwiftPubKey *)in_stack_ffffffffffffe978,ellswift);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffe968,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960,
             in_stack_ffffffffffffe958);
  ellswift_00.m_size._0_7_ = in_stack_ffffffffffffe988;
  ellswift_00.m_data = in_stack_ffffffffffffe980._M_current;
  ellswift_00.m_size._7_1_ = in_stack_ffffffffffffe98f;
  EllSwiftPubKey::EllSwiftPubKey((EllSwiftPubKey *)in_stack_ffffffffffffe978,ellswift_00);
  BIP324Cipher::BIP324Cipher
            (in_stack_ffffffffffffe968,(CKey *)in_stack_ffffffffffffe960,
             (EllSwiftPubKey *)in_stack_ffffffffffffe958);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
               (const_string *)in_stack_ffffffffffffe990,
               CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
               (const_string *)in_stack_ffffffffffffe980._M_current);
    BIP324Cipher::operator_cast_to_bool(in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe968,
               SUB81((ulong)in_stack_ffffffffffffe960 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe960,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    in_stack_ffffffffffffe958 = (BIP324Cipher *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_780,local_7a0,local_7c0,0x3d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
               (const_string *)in_stack_ffffffffffffe990,
               CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
               (const_string *)in_stack_ffffffffffffe980._M_current);
    BIP324Cipher::GetOurPubKey(in_stack_ffffffffffffe958);
    ::operator==((EllSwiftPubKey *)in_stack_ffffffffffffe968,
                 (EllSwiftPubKey *)in_stack_ffffffffffffe960);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe968,
               SUB81((ulong)in_stack_ffffffffffffe960 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe960,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    in_stack_ffffffffffffe958 = (BIP324Cipher *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7f8,local_818,local_838,0x3e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BIP324Cipher::Initialize
            ((BIP324Cipher *)CONCAT17(in_stack_ffffffffffffea8f,in_stack_ffffffffffffea88),
             in_stack_ffffffffffffea80,(bool)in_stack_ffffffffffffea7f,
             (bool)in_stack_ffffffffffffea7e);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
               (const_string *)in_stack_ffffffffffffe990,
               CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
               (const_string *)in_stack_ffffffffffffe980._M_current);
    boost::test_tools::assertion_result::assertion_result<BIP324Cipher>
              ((assertion_result *)in_stack_ffffffffffffe968,in_stack_ffffffffffffe960);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe960,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    in_stack_ffffffffffffe958 = (BIP324Cipher *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_870,local_890,local_8b0,0x40,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
               (const_string *)in_stack_ffffffffffffe990,
               CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
               (const_string *)in_stack_ffffffffffffe980._M_current);
    local_8f8 = BIP324Cipher::GetSessionID(in_stack_ffffffffffffe968);
    std::ranges::__equal_fn::
    operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
              ((__equal_fn *)&std::ranges::equal,&out_session_id,&local_8f8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe968,
               SUB81((ulong)in_stack_ffffffffffffe960 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe960,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    in_stack_ffffffffffffe958 = (BIP324Cipher *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8e8,local_918,local_938,0x43,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
               (const_string *)in_stack_ffffffffffffe990,
               CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
               (const_string *)in_stack_ffffffffffffe980._M_current);
    local_980 = BIP324Cipher::GetSendGarbageTerminator(in_stack_ffffffffffffe968);
    std::ranges::__equal_fn::
    operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
              ((__equal_fn *)&std::ranges::equal,&mid_send_garbage,&local_980);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe968,
               SUB81((ulong)in_stack_ffffffffffffe960 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe960,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    in_stack_ffffffffffffe958 = (BIP324Cipher *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_970,local_9a0,local_9c0,0x44,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
               (const_string *)in_stack_ffffffffffffe990,
               CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
               (const_string *)in_stack_ffffffffffffe980._M_current);
    local_a08 = BIP324Cipher::GetReceiveGarbageTerminator(in_stack_ffffffffffffe968);
    std::ranges::__equal_fn::
    operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
              ((__equal_fn *)&std::ranges::equal,&mid_recv_garbage,&local_a08);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe968,
               SUB81((ulong)in_stack_ffffffffffffe960 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe960,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe958);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,
               (pointer)in_stack_ffffffffffffe960,(unsigned_long)in_stack_ffffffffffffe958);
    in_stack_ffffffffffffe958 = (BIP324Cipher *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9f8,local_a28,local_a48,0x45,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe958);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe958);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>::allocator
            ((allocator<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
             in_stack_ffffffffffffe958);
  std::
  vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ::vector((vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
           (size_type)in_stack_ffffffffffffe980._M_current,
           (allocator_type *)in_stack_ffffffffffffe978);
  std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>::~allocator
            ((allocator<std::vector<std::byte,_std::allocator<std::byte>_>_> *)
             in_stack_ffffffffffffe958);
  for (i = 0; i < in_idx; i = i + 1) {
    std::
    vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
    ::operator[]((vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                  *)in_stack_ffffffffffffe968,(size_type)in_stack_ffffffffffffe960);
    std::vector<std::byte,_std::allocator<std::byte>_>::resize
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe978,
               CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970));
    Span<const_std::byte>::Span((Span<const_std::byte> *)in_stack_ffffffffffffe958);
    Span<const_std::byte>::Span((Span<const_std::byte> *)in_stack_ffffffffffffe958);
    std::
    vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
    ::operator[]((vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                  *)in_stack_ffffffffffffe968,(size_type)in_stack_ffffffffffffe960);
    Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<std::byte> *)in_stack_ffffffffffffe968,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960,
               in_stack_ffffffffffffe958);
    contents_02.m_size._0_7_ = in_stack_ffffffffffffea50;
    contents_02.m_data = (byte *)in_stack_ffffffffffffea48;
    contents_02.m_size._7_1_ = in_stack_ffffffffffffea57;
    aad_01.m_size._0_7_ = in_stack_ffffffffffffea40;
    aad_01.m_data = (byte *)in_stack_ffffffffffffea38;
    aad_01.m_size._7_1_ = in_stack_ffffffffffffea47;
    output.m_size._0_6_ = in_stack_ffffffffffffea78;
    output.m_data = (byte *)in_stack_ffffffffffffea70;
    output.m_size._6_1_ = in_stack_ffffffffffffea7e;
    output.m_size._7_1_ = in_stack_ffffffffffffea7f;
    in_stack_ffffffffffffe958 = local_a98;
    in_stack_ffffffffffffe960 = local_a90;
    BIP324Cipher::Encrypt
              ((BIP324Cipher *)CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8),
               contents_02,aad_01,SUB81((ulong)in_stack_ffffffffffffe9d0 >> 0x38,0),output);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe958);
  for (i_1 = 0; uVar3 = (undefined1)((ulong)in_stack_ffffffffffffe9d0 >> 0x38), i_1 < in_multiply;
      i_1 = i_1 + 1) {
    std::vector<std::byte,_std::allocator<std::byte>_>::end
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960);
    __gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>
    ::__normal_iterator<std::byte*>
              ((__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                *)in_stack_ffffffffffffe968,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                *)in_stack_ffffffffffffe960);
    std::vector<std::byte,_std::allocator<std::byte>_>::begin
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960);
    std::vector<std::byte,_std::allocator<std::byte>_>::end
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960);
    std::vector<std::byte,std::allocator<std::byte>>::
    insert<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>,void>
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe980._M_current
               ,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::size
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe958);
  std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_ffffffffffffe958);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
             (size_type)in_stack_ffffffffffffe980._M_current,
             (allocator_type *)in_stack_ffffffffffffe978);
  std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_ffffffffffffe958);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffe968,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960,
             in_stack_ffffffffffffe958);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffe968,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960,
             in_stack_ffffffffffffe958);
  Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<std::byte> *)in_stack_ffffffffffffe968,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe960,
             in_stack_ffffffffffffe958);
  contents_03.m_size._0_7_ = in_stack_ffffffffffffea50;
  contents_03.m_data = (byte *)in_stack_ffffffffffffea48;
  contents_03.m_size._7_1_ = in_stack_ffffffffffffea57;
  aad_02.m_size._0_7_ = in_stack_ffffffffffffea40;
  aad_02.m_data = (byte *)in_stack_ffffffffffffea38;
  aad_02.m_size._7_1_ = in_stack_ffffffffffffea47;
  output_00.m_size._0_6_ = in_stack_ffffffffffffea78;
  output_00.m_data = (byte *)in_stack_ffffffffffffea70;
  output_00.m_size._6_1_ = in_stack_ffffffffffffea7e;
  output_00.m_size._7_1_ = in_stack_ffffffffffffea7f;
  BIP324Cipher::Encrypt
            ((BIP324Cipher *)CONCAT17(in_stack_ffffffffffffe9df,in_stack_ffffffffffffe9d8),
             contents_03,aad_02,(bool)uVar3,output_00);
  bVar2 = std::vector<std::byte,_std::allocator<std::byte>_>::empty
                    ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
  this_00 = local_b10;
  pv_ = pBStack_b08;
  if (bVar2) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)local_b10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)local_b10);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      std::vector<std::byte,_std::allocator<std::byte>_>::size
                ((vector<std::byte,_std::allocator<std::byte>_> *)local_b10);
      std::vector<std::byte,_std::allocator<std::byte>_>::size
                ((vector<std::byte,_std::allocator<std::byte>_> *)local_b10);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)local_b10);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)local_b10);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)local_b10);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_bc0,local_be0,local_c00,0x5d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
      local_b10 = this_00;
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_ffffffffffffe968,
                 (vector<std::byte,_std::allocator<std::byte>_> *)pv_,this_00);
      std::vector<std::byte,_std::allocator<std::byte>_>::size
                ((vector<std::byte,_std::allocator<std::byte>_> *)this_00);
      local_c48 = Span<std::byte>::last((Span<std::byte> *)in_stack_ffffffffffffe968,(size_t)pv_);
      std::ranges::__equal_fn::
      operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                ((__equal_fn *)&std::ranges::equal,&out_ciphertext_endswith,&local_c48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_c38,local_c78,local_c98,0x5e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      std::operator==((vector<std::byte,_std::allocator<std::byte>_> *)
                      CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                      (vector<std::byte,_std::allocator<std::byte>_> *)
                      in_stack_ffffffffffffe980._M_current);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_b48,local_b68,local_b88,0x5b,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  error = 0;
  do {
    if (0xc < error) {
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::
      vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
      ::~vector((vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                 *)in_stack_ffffffffffffe968);
      BIP324Cipher::~BIP324Cipher(this_00);
      CKey::~CKey((CKey *)this_00);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe968)
      ;
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    BIP324Cipher::BIP324Cipher(in_stack_ffffffffffffe968,(CKey *)pv_,(EllSwiftPubKey *)this_00);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      BIP324Cipher::operator_cast_to_bool(this_00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_cd0,local_cf0,local_d10,0x6c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      BIP324Cipher::GetOurPubKey(this_00);
      uVar3 = ::operator==((EllSwiftPubKey *)in_stack_ffffffffffffe968,(EllSwiftPubKey *)pv_);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      plVar8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_d48,local_d68,local_d88,0x6d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    BIP324Cipher::Initialize
              ((BIP324Cipher *)CONCAT17(uVar3,in_stack_ffffffffffffea88),(EllSwiftPubKey *)plVar8,
               bVar2,(bool)in_stack_ffffffffffffea7e);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      boost::test_tools::assertion_result::assertion_result<BIP324Cipher>
                ((assertion_result *)in_stack_ffffffffffffe968,pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_dc0,local_de0,local_e00,0x6f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      local_e48 = BIP324Cipher::GetSessionID(in_stack_ffffffffffffe968);
      std::ranges::__equal_fn::
      operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                ((__equal_fn *)&std::ranges::equal,&out_session_id,&local_e48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_e38,local_e68,local_e88,0x72,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      pRVar13 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      local_ed0 = BIP324Cipher::GetSendGarbageTerminator(in_stack_ffffffffffffe968);
      uVar3 = std::ranges::__equal_fn::
              operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&mid_send_garbage,&local_ed0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_ec0,local_ef0,local_f10,0x73,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                 (const_string *)in_stack_ffffffffffffe990,
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                 (const_string *)in_stack_ffffffffffffe980._M_current);
      local_f58 = BIP324Cipher::GetReceiveGarbageTerminator(in_stack_ffffffffffffe968);
      uVar4 = std::ranges::__equal_fn::
              operator()<const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,&mid_recv_garbage,&local_f58);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
      plVar8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                 (unsigned_long)this_00);
      this_00 = (BIP324Cipher *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_f48,local_f78,local_f98,0x74,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_00);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_ffffffffffffea04 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffea04);
    } while (bVar2);
    if ((in_idx != 0) || (error != 0xc)) {
      uVar12 = in_idx;
      if (error == 0xc) {
        iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                          ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe980._M_current,
                           (int)((ulong)in_stack_ffffffffffffe978 >> 0x20));
        uVar6 = 1 << ((byte)iVar5 & 0x1f);
      }
      else {
        uVar6 = 0;
      }
      uVar7 = uVar12 ^ uVar6;
      for (i_2 = 0; i_2 < uVar7; i_2 = i_2 + 1) {
        in_stack_ffffffffffffe9f8 = i_2;
        if (in_idx <= i_2) {
          in_stack_ffffffffffffe9f8 = 0;
        }
        std::
        vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
        ::operator[]((vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                      *)in_stack_ffffffffffffe968,(size_type)pv_);
        Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<std::byte> *)in_stack_ffffffffffffe968,
                   (vector<std::byte,_std::allocator<std::byte>_> *)pv_,this_00);
        Span<std::byte>::first((Span<std::byte> *)in_stack_ffffffffffffe968,(size_t)pv_);
        Span<const_std::byte>::Span<std::byte,_0>
                  ((Span<const_std::byte> *)this_00,(Span<std::byte> *)0x41f4fd);
        input.m_data._7_1_ = in_stack_ffffffffffffe99f;
        input.m_data._0_7_ = in_stack_ffffffffffffe998;
        input.m_size = (size_t)in_stack_ffffffffffffe9a0;
        BIP324Cipher::DecryptLength(in_stack_ffffffffffffe968,input);
        std::
        vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
        ::operator[]((vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                      *)in_stack_ffffffffffffe968,(size_type)pv_);
        Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<std::byte> *)in_stack_ffffffffffffe968,
                   (vector<std::byte,_std::allocator<std::byte>_> *)pv_,this_00);
        Span<std::byte>::subspan((Span<std::byte> *)in_stack_ffffffffffffe968,(size_t)pv_);
        Span<const_std::byte>::Span<std::byte,_0>
                  ((Span<const_std::byte> *)this_00,(Span<std::byte> *)0x41f57d);
        Span<const_std::byte>::Span((Span<const_std::byte> *)this_00);
        Span<std::byte>::Span((Span<std::byte> *)this_00);
        input_01.m_size._0_7_ = in_stack_ffffffffffffea10;
        input_01.m_data = (byte *)plVar8;
        input_01.m_size._7_1_ = uVar4;
        aad.m_data._4_4_ = uVar6;
        aad.m_data._0_4_ = in_stack_ffffffffffffe9f8;
        aad.m_size._0_4_ = uVar12;
        aad.m_size._4_4_ = in_stack_ffffffffffffea04;
        contents_00.m_data._7_1_ = uVar3;
        contents_00.m_data._0_7_ = in_stack_ffffffffffffea30;
        contents_00.m_size = (size_t)pRVar13;
        this_00 = local_1020;
        pv_ = local_1018;
        BIP324Cipher::Decrypt
                  ((BIP324Cipher *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                   input_01,aad,(bool *)in_stack_ffffffffffffe9a0,contents_00);
      }
      std::vector<std::byte,_std::allocator<std::byte>_>::vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe9b0,
                 (vector<std::byte,_std::allocator<std::byte>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      if ((1 < error) && (error < 10)) {
        std::vector<std::byte,_std::allocator<std::byte>_>::size
                  ((vector<std::byte,_std::allocator<std::byte>_> *)this_00);
        RandomMixin<FastRandomContext>::randrange<unsigned_long>
                  ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe980._M_current,
                   (unsigned_long)in_stack_ffffffffffffe978);
        pvVar9 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                           ((vector<std::byte,_std::allocator<std::byte>_> *)
                            in_stack_ffffffffffffe968,(size_type)pv_);
        *pvVar9 = *pvVar9 ^ (value_type)(1 << ((char)error - 2U & 0x1f));
      }
      MakeByteSpan<std::vector<std::byte,std::allocator<std::byte>>&>
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      Span<const_std::byte>::first((Span<const_std::byte> *)in_stack_ffffffffffffe968,(size_t)pv_);
      input_00.m_data._7_1_ = in_stack_ffffffffffffe99f;
      input_00.m_data._0_7_ = in_stack_ffffffffffffe998;
      input_00.m_size = (size_t)in_stack_ffffffffffffe9a0;
      BIP324Cipher::DecryptLength(in_stack_ffffffffffffe968,input_00);
      std::vector<std::byte,_std::allocator<std::byte>_>::resize
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe978,
                 CONCAT17(in_stack_ffffffffffffe977,in_stack_ffffffffffffe970));
      std::vector<std::byte,_std::allocator<std::byte>_>::vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe9b0,
                 (vector<std::byte,_std::allocator<std::byte>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      if (error == 10) {
        sVar10 = std::vector<std::byte,_std::allocator<std::byte>_>::size
                           ((vector<std::byte,_std::allocator<std::byte>_> *)this_00);
        if (sVar10 != 0) {
          iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                            ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe980._M_current,
                             (int)((ulong)in_stack_ffffffffffffe978 >> 0x20));
          vVar11 = (value_type)(1 << ((byte)iVar5 & 0x1f));
          std::vector<std::byte,_std::allocator<std::byte>_>::size
                    ((vector<std::byte,_std::allocator<std::byte>_> *)this_00);
          RandomMixin<FastRandomContext>::randrange<unsigned_long>
                    ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffe980._M_current,
                     (unsigned_long)in_stack_ffffffffffffe978);
          pvVar9 = std::vector<std::byte,_std::allocator<std::byte>_>::operator[]
                             ((vector<std::byte,_std::allocator<std::byte>_> *)
                              in_stack_ffffffffffffe968,(size_type)pv_);
          *pvVar9 = *pvVar9 ^ vVar11;
          goto LAB_0041f889;
        }
      }
      else {
LAB_0041f889:
        if (error == 0xb) {
          std::vector<std::byte,_std::allocator<std::byte>_>::push_back
                    ((vector<std::byte,_std::allocator<std::byte>_> *)this_00,(value_type *)0x41f8b0
                    );
        }
        std::allocator<std::byte>::allocator((allocator<std::byte> *)this_00);
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  ((vector<std::byte,_std::allocator<std::byte>_> *)
                   CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                   (size_type)in_stack_ffffffffffffe980._M_current,
                   (allocator_type *)in_stack_ffffffffffffe978);
        std::allocator<std::byte>::~allocator((allocator<std::byte> *)this_00);
        dec_ignore = false;
        Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<std::byte> *)in_stack_ffffffffffffe968,
                   (vector<std::byte,_std::allocator<std::byte>_> *)pv_,this_00);
        local_10a8 = Span<std::byte>::subspan
                               ((Span<std::byte> *)in_stack_ffffffffffffe968,(size_t)pv_);
        Span<const_std::byte>::Span<std::byte,_0>
                  ((Span<const_std::byte> *)this_00,(Span<std::byte> *)0x41f96f);
        Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<const_std::byte> *)in_stack_ffffffffffffe968,
                   (vector<std::byte,_std::allocator<std::byte>_> *)pv_,this_00);
        Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<std::byte> *)in_stack_ffffffffffffe968,
                   (vector<std::byte,_std::allocator<std::byte>_> *)pv_,this_00);
        input_02.m_size._0_7_ = in_stack_ffffffffffffea10;
        input_02.m_data = (byte *)plVar8;
        input_02.m_size._7_1_ = uVar4;
        aad_00.m_data._4_4_ = uVar6;
        aad_00.m_data._0_4_ = in_stack_ffffffffffffe9f8;
        aad_00.m_size._0_4_ = uVar12;
        aad_00.m_size._4_4_ = in_stack_ffffffffffffea04;
        contents_01.m_data._7_1_ = uVar3;
        contents_01.m_data._0_7_ = in_stack_ffffffffffffea30;
        contents_01.m_size = (size_t)pRVar13;
        this_00 = local_10d8;
        pv_ = local_10d0;
        bVar2 = BIP324Cipher::Decrypt
                          ((BIP324Cipher *)
                           CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),input_02,
                           aad_00,(bool *)in_stack_ffffffffffffe9a0,contents_01);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                     (unsigned_long)this_00);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)this_00);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                     (const_string *)in_stack_ffffffffffffe990,
                     CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                     (const_string *)in_stack_ffffffffffffe980._M_current);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
          in_stack_ffffffffffffe9b0 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                     (unsigned_long)this_00);
          boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                     (unsigned_long)this_00);
          this_00 = (BIP324Cipher *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_1110,local_1130,local_1150,0x99,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)this_00);
          boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
          in_stack_ffffffffffffe9af = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_ffffffffffffe9af);
        if (bVar2) {
          do {
            in_stack_ffffffffffffe9a0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                       (unsigned_long)this_00);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)this_00);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                       (const_string *)in_stack_ffffffffffffe990,
                       CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                       (const_string *)in_stack_ffffffffffffe980._M_current);
            in_stack_ffffffffffffe99f =
                 std::operator==((vector<std::byte,_std::allocator<std::byte>_> *)
                                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                                 (vector<std::byte,_std::allocator<std::byte>_> *)
                                 in_stack_ffffffffffffe980._M_current);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
            in_stack_ffffffffffffe990 = boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                       (unsigned_long)this_00);
            boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                       (unsigned_long)this_00);
            this_00 = (BIP324Cipher *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_1188,local_11a8,local_11c8,0x9b,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)this_00);
            boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
            in_stack_ffffffffffffe98f = boost::test_tools::tt_detail::dummy_cond();
          } while ((bool)in_stack_ffffffffffffe98f);
          do {
            in_stack_ffffffffffffe980._M_current =
                 (uchar *)boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                       (unsigned_long)this_00);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)this_00);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_ffffffffffffe99f,in_stack_ffffffffffffe998),
                       (const_string *)in_stack_ffffffffffffe990,
                       CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988),
                       (const_string *)in_stack_ffffffffffffe980._M_current);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)in_stack_ffffffffffffe968,SUB81((ulong)pv_ >> 0x38,0));
            in_stack_ffffffffffffe978 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                       (unsigned_long)this_00);
            boost::unit_test::operator<<((lazy_ostream *)pv_,(basic_cstring<const_char> *)this_00);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_ffffffffffffe968,(pointer)pv_,
                       (unsigned_long)this_00);
            this_00 = (BIP324Cipher *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_1200,local_1220,local_1240,0x9c,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)this_00);
            boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
            in_stack_ffffffffffffe977 = boost::test_tools::tt_detail::dummy_cond();
          } while ((bool)in_stack_ffffffffffffe977);
        }
        std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                  ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      }
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffe968);
    }
    BIP324Cipher::~BIP324Cipher(this_00);
    error = error + 1;
  } while( true );
}

Assistant:

void TestBIP324PacketVector(
    uint32_t in_idx,
    const std::string& in_priv_ours_hex,
    const std::string& in_ellswift_ours_hex,
    const std::string& in_ellswift_theirs_hex,
    bool in_initiating,
    const std::string& in_contents_hex,
    uint32_t in_multiply,
    const std::string& in_aad_hex,
    bool in_ignore,
    const std::string& mid_send_garbage_hex,
    const std::string& mid_recv_garbage_hex,
    const std::string& out_session_id_hex,
    const std::string& out_ciphertext_hex,
    const std::string& out_ciphertext_endswith_hex)
{
    // Convert input from hex to char/byte vectors/arrays.
    const auto in_priv_ours = ParseHex(in_priv_ours_hex);
    const auto in_ellswift_ours = ParseHex<std::byte>(in_ellswift_ours_hex);
    const auto in_ellswift_theirs = ParseHex<std::byte>(in_ellswift_theirs_hex);
    const auto in_contents = ParseHex<std::byte>(in_contents_hex);
    const auto in_aad = ParseHex<std::byte>(in_aad_hex);
    const auto mid_send_garbage = ParseHex<std::byte>(mid_send_garbage_hex);
    const auto mid_recv_garbage = ParseHex<std::byte>(mid_recv_garbage_hex);
    const auto out_session_id = ParseHex<std::byte>(out_session_id_hex);
    const auto out_ciphertext = ParseHex<std::byte>(out_ciphertext_hex);
    const auto out_ciphertext_endswith = ParseHex<std::byte>(out_ciphertext_endswith_hex);

    // Load keys
    CKey key;
    key.Set(in_priv_ours.begin(), in_priv_ours.end(), true);
    EllSwiftPubKey ellswift_ours(in_ellswift_ours);
    EllSwiftPubKey ellswift_theirs(in_ellswift_theirs);

    // Instantiate encryption BIP324 cipher.
    BIP324Cipher cipher(key, ellswift_ours);
    BOOST_CHECK(!cipher);
    BOOST_CHECK(cipher.GetOurPubKey() == ellswift_ours);
    cipher.Initialize(ellswift_theirs, in_initiating);
    BOOST_CHECK(cipher);

    // Compare session variables.
    BOOST_CHECK(std::ranges::equal(out_session_id, cipher.GetSessionID()));
    BOOST_CHECK(std::ranges::equal(mid_send_garbage, cipher.GetSendGarbageTerminator()));
    BOOST_CHECK(std::ranges::equal(mid_recv_garbage, cipher.GetReceiveGarbageTerminator()));

    // Vector of encrypted empty messages, encrypted in order to seek to the right position.
    std::vector<std::vector<std::byte>> dummies(in_idx);

    // Seek to the numbered packet.
    for (uint32_t i = 0; i < in_idx; ++i) {
        dummies[i].resize(cipher.EXPANSION);
        cipher.Encrypt({}, {}, true, dummies[i]);
    }

    // Construct contents and encrypt it.
    std::vector<std::byte> contents;
    for (uint32_t i = 0; i < in_multiply; ++i) {
        contents.insert(contents.end(), in_contents.begin(), in_contents.end());
    }
    std::vector<std::byte> ciphertext(contents.size() + cipher.EXPANSION);
    cipher.Encrypt(contents, in_aad, in_ignore, ciphertext);

    // Verify ciphertext. Note that the test vectors specify either out_ciphertext (for short
    // messages) or out_ciphertext_endswith (for long messages), so only check the relevant one.
    if (!out_ciphertext.empty()) {
        BOOST_CHECK(out_ciphertext == ciphertext);
    } else {
        BOOST_CHECK(ciphertext.size() >= out_ciphertext_endswith.size());
        BOOST_CHECK(std::ranges::equal(out_ciphertext_endswith, Span{ciphertext}.last(out_ciphertext_endswith.size())));
    }

    for (unsigned error = 0; error <= 12; ++error) {
        // error selects a type of error introduced:
        // - error=0: no errors, decryption should be successful
        // - error=1: wrong side
        // - error=2..9: bit error in ciphertext
        // - error=10: bit error in aad
        // - error=11: extra 0x00 at end of aad
        // - error=12: message index wrong

        // Instantiate self-decrypting BIP324 cipher.
        BIP324Cipher dec_cipher(key, ellswift_ours);
        BOOST_CHECK(!dec_cipher);
        BOOST_CHECK(dec_cipher.GetOurPubKey() == ellswift_ours);
        dec_cipher.Initialize(ellswift_theirs, (error == 1) ^ in_initiating, /*self_decrypt=*/true);
        BOOST_CHECK(dec_cipher);

        // Compare session variables.
        BOOST_CHECK(std::ranges::equal(out_session_id, dec_cipher.GetSessionID()) == (error != 1));
        BOOST_CHECK(std::ranges::equal(mid_send_garbage, dec_cipher.GetSendGarbageTerminator()) == (error != 1));
        BOOST_CHECK(std::ranges::equal(mid_recv_garbage, dec_cipher.GetReceiveGarbageTerminator()) == (error != 1));

        // Seek to the numbered packet.
        if (in_idx == 0 && error == 12) continue;
        uint32_t dec_idx = in_idx ^ (error == 12 ? (1U << m_rng.randrange(16)) : 0);
        for (uint32_t i = 0; i < dec_idx; ++i) {
            unsigned use_idx = i < in_idx ? i : 0;
            bool dec_ignore{false};
            dec_cipher.DecryptLength(Span{dummies[use_idx]}.first(cipher.LENGTH_LEN));
            dec_cipher.Decrypt(Span{dummies[use_idx]}.subspan(cipher.LENGTH_LEN), {}, dec_ignore, {});
        }

        // Construct copied (and possibly damaged) copy of ciphertext.
        // Decrypt length
        auto to_decrypt = ciphertext;
        if (error >= 2 && error <= 9) {
            to_decrypt[m_rng.randrange(to_decrypt.size())] ^= std::byte(1U << (error - 2));
        }

        // Decrypt length and resize ciphertext to accommodate.
        uint32_t dec_len = dec_cipher.DecryptLength(MakeByteSpan(to_decrypt).first(cipher.LENGTH_LEN));
        to_decrypt.resize(dec_len + cipher.EXPANSION);

        // Construct copied (and possibly damaged) copy of aad.
        auto dec_aad = in_aad;
        if (error == 10) {
            if (in_aad.size() == 0) continue;
            dec_aad[m_rng.randrange(dec_aad.size())] ^= std::byte(1U << m_rng.randrange(8));
        }
        if (error == 11) dec_aad.push_back({});

        // Decrypt contents.
        std::vector<std::byte> decrypted(dec_len);
        bool dec_ignore{false};
        bool dec_ok = dec_cipher.Decrypt(Span{to_decrypt}.subspan(cipher.LENGTH_LEN), dec_aad, dec_ignore, decrypted);

        // Verify result.
        BOOST_CHECK(dec_ok == !error);
        if (dec_ok) {
            BOOST_CHECK(decrypted == contents);
            BOOST_CHECK(dec_ignore == in_ignore);
        }
    }
}